

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgx_dec.c
# Opt level: O0

int pgx_validate(jas_stream_t *in)

{
  int iVar1;
  int iVar2;
  int local_2c;
  int n;
  int i;
  uint_fast32_t magic;
  jas_stream_t *pjStack_18;
  uchar buf [2];
  jas_stream_t *in_local;
  
  pjStack_18 = in;
  iVar1 = jas_stream_read(in,(void *)((long)&magic + 6),2);
  local_2c = iVar1;
  if (-1 < iVar1) {
    do {
      local_2c = local_2c + -1;
      if (local_2c < 0) {
        if (iVar1 < 2) {
          return -1;
        }
        if (CONCAT11(magic._6_1_,magic._7_1_) == 0x5047) {
          return 0;
        }
        return -1;
      }
      iVar2 = jas_stream_ungetc(pjStack_18,(uint)*(byte *)((long)&magic + (long)local_2c + 6));
    } while (iVar2 != -1);
  }
  return -1;
}

Assistant:

int pgx_validate(jas_stream_t *in)
{
	jas_uchar buf[PGX_MAGICLEN];
	uint_fast32_t magic;
	int i;
	int n;

	assert(JAS_STREAM_MAXPUTBACK >= PGX_MAGICLEN);

	/* Read the validation data (i.e., the data used for detecting
	  the format). */
	if ((n = jas_stream_read(in, buf, PGX_MAGICLEN)) < 0) {
		return -1;
	}

	/* Put the validation data back onto the stream, so that the
	  stream position will not be changed. */
	for (i = n - 1; i >= 0; --i) {
		if (jas_stream_ungetc(in, buf[i]) == EOF) {
			return -1;
		}
	}

	/* Did we read enough data? */
	if (n < PGX_MAGICLEN) {
		return -1;
	}

	/* Compute the signature value. */
	magic = (buf[0] << 8) | buf[1];

	/* Ensure that the signature is correct for this format. */
	if (magic != PGX_MAGIC) {
		return -1;
	}

	return 0;
}